

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

scalar __thiscall
absl::make_unique<s2shapeutil::VectorShapeFactory,s2shapeutil::VectorShapeFactory_const&>
          (absl *this,VectorShapeFactory *args)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)operator_new(0x18);
  *puVar2 = &PTR__VectorShapeFactory_002bd178;
  puVar2[1] = (args->shared_shapes_).
              super___shared_ptr<std::vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  p_Var1 = (args->shared_shapes_).
           super___shared_ptr<std::vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  puVar2[2] = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  *(undefined8 **)this = puVar2;
  return (__uniq_ptr_data<s2shapeutil::VectorShapeFactory,_std::default_delete<s2shapeutil::VectorShapeFactory>,_true,_true>
          )(__uniq_ptr_data<s2shapeutil::VectorShapeFactory,_std::default_delete<s2shapeutil::VectorShapeFactory>,_true,_true>
            )this;
}

Assistant:

typename memory_internal::MakeUniqueResult<T>::scalar make_unique(
    Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}